

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.hpp
# Opt level: O1

tuple<czh::utils::DiyFp,_czh::utils::DiyFp> * __thiscall
czh::utils::DiyFp::normalized_boundaries
          (tuple<czh::utils::DiyFp,_czh::utils::DiyFp> *__return_storage_ptr__,DiyFp *this)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  
  uVar2 = this->f;
  uVar5 = uVar2 * 2 + 1;
  iVar1 = this->e;
  iVar6 = iVar1 + -1;
  if ((uVar2 >> 0x34 & 1) == 0) {
    lVar4 = 0x3f;
    if ((uVar5 & 0x1fffffffffffff) != 0) {
      for (; (uVar5 & 0x1fffffffffffff) >> lVar4 == 0; lVar4 = lVar4 + -1) {
      }
    }
    uVar5 = uVar5 << (~(byte)lVar4 + 0x36 & 0x3f);
    iVar6 = (iVar1 - ((uint)lVar4 ^ 0x3f)) + 9;
  }
  iVar6 = iVar6 + -10;
  iVar3 = iVar1 + -1;
  if (uVar2 == 0x10000000000000) {
    iVar3 = iVar1 + -2;
  }
  lVar4 = 0x3fffffffffffff;
  if (uVar2 != 0x10000000000000) {
    lVar4 = uVar2 * 2 + -1;
  }
  (__return_storage_ptr__->super__Tuple_impl<0UL,_czh::utils::DiyFp,_czh::utils::DiyFp>).
  super__Tuple_impl<1UL,_czh::utils::DiyFp>.super__Head_base<1UL,_czh::utils::DiyFp,_false>.
  _M_head_impl.f = uVar5 << 10;
  (__return_storage_ptr__->super__Tuple_impl<0UL,_czh::utils::DiyFp,_czh::utils::DiyFp>).
  super__Tuple_impl<1UL,_czh::utils::DiyFp>.super__Head_base<1UL,_czh::utils::DiyFp,_false>.
  _M_head_impl.e = iVar6;
  (__return_storage_ptr__->super__Tuple_impl<0UL,_czh::utils::DiyFp,_czh::utils::DiyFp>).
  super__Head_base<0UL,_czh::utils::DiyFp,_false>._M_head_impl.f =
       lVar4 << ((char)iVar3 - (char)iVar6 & 0x3fU);
  (__return_storage_ptr__->super__Tuple_impl<0UL,_czh::utils::DiyFp,_czh::utils::DiyFp>).
  super__Head_base<0UL,_czh::utils::DiyFp,_false>._M_head_impl.e = iVar6;
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] std::tuple<DiyFp, DiyFp> normalized_boundaries() const
    {
      DiyFp pl, mi;
      bool significand_is_zero = f == DP_HIDDEN_BIT;
      pl.f = (f << 1) + 1;
      pl.e = e - 1;
      pl = pl.normalize_boundary();
      if (significand_is_zero)
      {
        mi.f = (f << 2) - 1;
        mi.e = e - 2;
      }
      else
      {
        mi.f = (f << 1) - 1;
        mi.e = e - 1;
      }
      mi.f <<= mi.e - pl.e;
      mi.e = pl.e;
      return {mi, pl};
    }